

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
boost::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,
                 dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  ctype *this;
  char cVar5;
  size_type pos;
  long lVar6;
  long lVar7;
  locale local_48 [8];
  sentry cerberos;
  
  std::ostream::sentry::sentry((sentry *)&cerberos,os);
  if (cerberos == (sentry)0x1) {
    std::locale::locale(local_48,(locale *)(os + *(long *)(*(long *)os + -0x18) + 0xd0));
    this = std::use_facet<std::ctype<char>>(local_48);
    std::locale::~locale(local_48);
    std::ctype<char>::widen((ctype<char> *)this,'0');
    std::ctype<char>::widen((ctype<char> *)this,'1');
    uVar1 = *(ulong *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
    uVar2 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0xe8);
    uVar3 = b->m_num_bits;
    std::ios::fill();
    lVar6 = uVar1 - uVar3;
    if (uVar1 < uVar3) {
      lVar6 = 0;
    }
    if ((long)uVar1 < 1) {
      lVar6 = 0;
    }
    cVar5 = (char)uVar2;
    if ((0 < lVar6) && ((*(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xb0) != 0x20)) {
      lVar6 = 0;
      lVar7 = 0;
      if (uVar3 <= uVar1) {
        lVar7 = uVar1 - uVar3;
      }
      lVar7 = lVar7 + 1;
      do {
        iVar4 = std::streambuf::sputc(cVar5);
        if (iVar4 == -1) goto LAB_0015a96a;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    pos = b->m_num_bits;
    do {
      pos = pos - 1;
      if (pos == 0xffffffffffffffff) {
        if (lVar6 < 1) goto LAB_0015a9ae;
        lVar6 = lVar6 + 1;
        goto LAB_0015a996;
      }
      dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(b,pos);
      iVar4 = std::streambuf::sputc(cVar5);
    } while (iVar4 != -1);
LAB_0015a96a:
    lVar6 = *(long *)os;
    *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 0x10) = 0;
    std::ios::setstate((int)*(undefined8 *)(lVar6 + -0x18) + (int)os);
  }
  goto LAB_0015a9c1;
  while (lVar6 = lVar6 + -1, 1 < lVar6) {
LAB_0015a996:
    iVar4 = std::streambuf::sputc(cVar5);
    if (iVar4 == -1) goto LAB_0015a96a;
  }
LAB_0015a9ae:
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
LAB_0015a9c1:
  std::ostream::sentry::~sentry((sentry *)&cerberos);
  return os;
}

Assistant:

std::basic_ostream<Ch, Tr>&
operator<<(std::basic_ostream<Ch, Tr>& os,
           const dynamic_bitset<Block, Alloc>& b)
{

    using namespace std;

    const ios_base::iostate ok = ios_base::goodbit;
    ios_base::iostate err = ok;

    typename basic_ostream<Ch, Tr>::sentry cerberos(os);
    if (cerberos) {

        BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, os.getloc());
        const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
        const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

        BOOST_TRY {

            typedef typename dynamic_bitset<Block, Alloc>::size_type bitset_size_type;
            typedef basic_streambuf<Ch, Tr> buffer_type;

            buffer_type * buf = os.rdbuf();
            // careful: os.width() is signed (and can be < 0)
            const bitset_size_type width = (os.width() <= 0) ? 0 : static_cast<bitset_size_type>(os.width());
            streamsize npad = (width <= b.size()) ? 0 : width - b.size();

            const Ch fill_char = os.fill();
            const ios_base::fmtflags adjustfield = os.flags() & ios_base::adjustfield;

            // if needed fill at left; pad is decreased along the way
            if (adjustfield != ios_base::left) {
                for (; 0 < npad; --npad)
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                          err |= ios_base::failbit;
                          break;
                    }
            }

            if (err == ok) {
                // output the bitset
                for (bitset_size_type i = b.size(); 0 < i; --i) {
                    typename buffer_type::int_type
                        ret = buf->sputc(b.test(i-1)? one : zero);
                    if (Tr::eq_int_type(Tr::eof(), ret)) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }

            if (err == ok) {
                // if needed fill at right
                for (; 0 < npad; --npad) {
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }


            os.width(0);

        } BOOST_CATCH (...) { // see std 27.6.1.1/4
            bool rethrow = false;
            BOOST_TRY { os.setstate(ios_base::failbit); } BOOST_CATCH (...) { rethrow = true; } BOOST_CATCH_END

            if (rethrow)
                BOOST_RETHROW;
        }